

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

Integer pnga_pgroup_split_irreg(Integer grp,Integer mycolor)

{
  Integer *list;
  void *__s;
  long grp_00;
  long lVar1;
  Integer IVar2;
  long lVar3;
  long n;
  size_t __size;
  
  __size = GAnproc << 3;
  list = (Integer *)malloc(__size);
  __s = malloc(__size);
  if (mycolor < 0) {
    pnga_error("Invalid argument (color < 0)",mycolor);
  }
  grp_00 = (long)GA_Default_Proc_Group;
  pnga_pgroup_set_default(grp);
  lVar1 = (long)GA_Default_Proc_Group;
  n = GAnproc;
  if (0 < lVar1) {
    n = (long)PGRP_LIST[lVar1].map_nproc;
  }
  lVar3 = GAme;
  if (0 < GA_Default_Proc_Group) {
    lVar3 = (long)PGRP_LIST[lVar1].map_proc_list[GAme];
  }
  if (0 < n) {
    memset(__s,0,n * 8);
  }
  *(Integer *)((long)__s + lVar3 * 8) = mycolor;
  IVar2 = pnga_type_f2c(0x3f2);
  pnga_gop(IVar2,__s,n,"+");
  if (n < 1) {
    IVar2 = 0;
  }
  else {
    lVar1 = 0;
    IVar2 = 0;
    do {
      if (*(long *)((long)__s + lVar1 * 8) == mycolor) {
        list[IVar2] = lVar1;
        IVar2 = IVar2 + 1;
      }
      lVar1 = lVar1 + 1;
    } while (n != lVar1);
  }
  IVar2 = pnga_pgroup_create(list,IVar2);
  pnga_pgroup_set_default(grp_00);
  free(list);
  free(__s);
  return IVar2;
}

Assistant:

Integer pnga_pgroup_split_irreg(Integer grp, Integer mycolor)
{
  Integer nprocs, me, default_grp, grp_id;
  Integer i, icnt=0;
  Integer *nodes, *color_arr;
  
  
  /* Allocate temporary arrays */
  nodes = (Integer*)malloc(GAnproc*sizeof(Integer));
  color_arr = (Integer*)malloc(GAnproc*sizeof(Integer));

  if(mycolor<0) pnga_error("Invalid argument (color < 0)",mycolor);

  default_grp = pnga_pgroup_get_default();
  pnga_pgroup_set_default(grp);
  nprocs = pnga_nnodes();
  me = pnga_nodeid();

  /* Figure out what procs are in my group */
  for(i=0; i<nprocs; i++) color_arr[i] = 0;
  color_arr[me] = mycolor;
  pnga_gop(pnga_type_f2c(MT_F_INT), color_arr, nprocs, "+");

  for (icnt=0, i=0; i<nprocs; i++) {
     if(color_arr[i] == mycolor) {
        nodes[icnt] = i;
        icnt++;
     }
  }

  grp_id = pnga_pgroup_create(nodes, icnt);

  pnga_pgroup_set_default(default_grp);

  /* Free temporary arrays */
  free(nodes);
  free(color_arr);


  return grp_id;
}